

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

Vec_Str_t * Pdr_InvPrintStr(Vec_Int_t *vInv,Vec_Int_t *vCounts)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  int *piVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  Vec_Int_t *__ptr;
  void *__s;
  long lVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  pcVar7 = (char *)malloc(1000);
  pVVar6->pArray = pcVar7;
  __ptr = Pdr_InvMap(vCounts);
  iVar11 = vCounts->nSize;
  if ((long)iVar11 < 1) {
    uVar14 = 0;
  }
  else {
    lVar8 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + (vCounts->pArray[lVar8] == 0);
      lVar8 = lVar8 + 1;
    } while (iVar11 != lVar8);
  }
  uVar12 = iVar11 - uVar14;
  piVar3 = vInv->pArray;
  __s = malloc((ulong)uVar12);
  if (0 < (int)uVar12) {
    memset(__s,0x2d,(ulong)(~uVar14 + iVar11) + 1);
  }
  if (*piVar3 < 1) {
    uVar14 = 0;
  }
  else {
    iVar11 = 0;
    piVar5 = piVar3;
    do {
      piVar10 = piVar5 + 1;
      iVar2 = *piVar10;
      if (0 < (long)iVar2) {
        lVar8 = 0;
        do {
          uVar14 = piVar5[lVar8 + 2];
          if ((int)uVar14 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if (__ptr->nSize <= (int)(uVar14 >> 1)) goto LAB_005f1ddb;
          lVar8 = lVar8 + 1;
          *(byte *)((long)__s + (long)__ptr->pArray[uVar14 >> 1]) = (byte)uVar14 & 1 ^ 0x31;
        } while (iVar2 != lVar8);
      }
      if (0 < (int)uVar12) {
        uVar13 = 0;
        do {
          cVar1 = *(char *)((long)__s + uVar13);
          uVar14 = pVVar6->nSize;
          if (uVar14 == pVVar6->nCap) {
            if ((int)uVar14 < 0x10) {
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar14 * 2;
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar4);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,sVar4);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = (int)sVar4;
            }
          }
          else {
            pcVar7 = pVVar6->pArray;
          }
          pVVar6->nSize = uVar14 + 1;
          pcVar7[(int)uVar14] = cVar1;
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      uVar14 = pVVar6->nSize;
      if (uVar14 == pVVar6->nCap) {
        if ((int)uVar14 < 0x10) {
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
          }
          pVVar6->pArray = pcVar7;
          pVVar6->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar14 * 2;
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar4);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,sVar4);
          }
          pVVar6->pArray = pcVar7;
          pVVar6->nCap = (int)sVar4;
        }
      }
      else {
        pcVar7 = pVVar6->pArray;
      }
      pVVar6->nSize = uVar14 + 1;
      pcVar7[(int)uVar14] = ' ';
      uVar14 = pVVar6->nSize;
      if (uVar14 == pVVar6->nCap) {
        if ((int)uVar14 < 0x10) {
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
          }
          pVVar6->pArray = pcVar7;
          pVVar6->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar14 * 2;
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar4);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,sVar4);
          }
          pVVar6->pArray = pcVar7;
          pVVar6->nCap = (int)sVar4;
        }
      }
      else {
        pcVar7 = pVVar6->pArray;
      }
      pVVar6->nSize = uVar14 + 1;
      pcVar7[(int)uVar14] = '1';
      uVar14 = pVVar6->nSize;
      if (uVar14 == pVVar6->nCap) {
        if ((int)uVar14 < 0x10) {
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
          }
          pVVar6->pArray = pcVar7;
          pVVar6->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar14 * 2;
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar4);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,sVar4);
          }
          pVVar6->pArray = pcVar7;
          pVVar6->nCap = (int)sVar4;
        }
      }
      else {
        pcVar7 = pVVar6->pArray;
      }
      pVVar6->nSize = uVar14 + 1;
      pcVar7[(int)uVar14] = '\n';
      lVar8 = (long)*piVar10;
      if (0 < lVar8) {
        lVar9 = 0;
        do {
          if (piVar5[lVar9 + 2] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar14 = (uint)piVar5[lVar9 + 2] >> 1;
          if (__ptr->nSize <= (int)uVar14) {
LAB_005f1ddb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          lVar9 = lVar9 + 1;
          *(undefined1 *)((long)__s + (long)__ptr->pArray[uVar14]) = 0x2d;
        } while (lVar8 != lVar9);
      }
      iVar11 = iVar11 + 1;
      piVar5 = piVar10 + lVar8;
    } while (iVar11 < *piVar3);
    uVar12 = pVVar6->nCap;
    uVar14 = pVVar6->nSize;
    if (uVar14 == uVar12) {
      if ((int)uVar12 < 0x10) {
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar12 * 2;
        if (pVVar6->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar4);
        }
        else {
          pcVar7 = (char *)realloc(pVVar6->pArray,sVar4);
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = (int)sVar4;
      }
      goto LAB_005f1d56;
    }
  }
  pcVar7 = pVVar6->pArray;
LAB_005f1d56:
  pVVar6->nSize = uVar14 + 1;
  pcVar7[(int)uVar14] = '\0';
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return pVVar6;
}

Assistant:

Vec_Str_t * Pdr_InvPrintStr( Vec_Int_t * vInv, Vec_Int_t * vCounts )
{
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_Int_t * vMap = Pdr_InvMap( vCounts );
    int nVars = Vec_IntSize(vCounts) - Vec_IntCountZero(vCounts);
    int i, k, * pCube, * pList = Vec_IntArray(vInv);
    char * pBuffer = ABC_ALLOC( char, (size_t)(unsigned)nVars );
    for ( i = 0; i < nVars; i++ )
        pBuffer[i] = '-';
    Pdr_ForEachCube( pList, pCube, i )
    {
        for ( k = 0; k < pCube[0]; k++ )
            pBuffer[Vec_IntEntry(vMap, Abc_Lit2Var(pCube[k+1]))] = '0' + !Abc_LitIsCompl(pCube[k+1]);
        for ( k = 0; k < nVars; k++ )
            Vec_StrPush( vStr, pBuffer[k] );
        Vec_StrPush( vStr, ' ' );
        Vec_StrPush( vStr, '1' );
        Vec_StrPush( vStr, '\n' );
        for ( k = 0; k < pCube[0]; k++ )
            pBuffer[Vec_IntEntry(vMap, Abc_Lit2Var(pCube[k+1]))] = '-';
    }
    Vec_StrPush( vStr, '\0' );
    ABC_FREE( pBuffer );
    Vec_IntFree( vMap );
    return vStr;
}